

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O1

REF_STATUS ref_egads_gap(REF_GEOM ref_geom,REF_INT node,REF_DBL *gap)

{
  int iVar1;
  REF_ADJ_ITEM pRVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 uVar6;
  REF_INT RVar7;
  REF_BOOL has_edge;
  REF_BOOL has_node;
  REF_DBL face_xyz [3];
  int local_40;
  int local_3c;
  REF_DBL local_38 [3];
  
  *gap = 0.0;
  uVar4 = ref_geom_is_a(ref_geom,node,0,&local_3c);
  if (uVar4 == 0) {
    uVar4 = ref_geom_is_a(ref_geom,node,1,&local_40);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0xef4
             ,"ref_egads_gap",(ulong)uVar4,"n");
      return uVar4;
    }
    if (local_40 == 0) {
      return 0;
    }
    uVar5 = 0xffffffff;
    if (-1 < node) {
      uVar5 = 0xffffffff;
      if (node < ref_geom->ref_adj->nnode) {
        uVar5 = (ulong)(uint)ref_geom->ref_adj->first[(uint)node];
      }
    }
    if ((int)uVar5 != -1) {
      RVar7 = ref_geom->ref_adj->item[(int)uVar5].ref;
      do {
        if ((uint)(local_3c == 0) * 2 == ref_geom->descr[RVar7 * 6]) {
          uVar4 = ref_egads_eval(ref_geom,RVar7,local_38,(REF_DBL *)0x0);
          uVar6 = 0xefe;
          goto LAB_00241612;
        }
        pRVar2 = ref_geom->ref_adj->item;
        iVar1 = pRVar2[(int)uVar5].next;
        uVar5 = (ulong)iVar1;
        if (uVar5 == 0xffffffffffffffff) {
          RVar7 = -1;
        }
        else {
          RVar7 = pRVar2[uVar5].ref;
        }
      } while (iVar1 != -1);
    }
    uVar5 = 0xffffffff;
    if (-1 < node) {
      uVar5 = 0xffffffff;
      if (node < ref_geom->ref_adj->nnode) {
        uVar5 = (ulong)(uint)ref_geom->ref_adj->first[(uint)node];
      }
    }
    if ((int)uVar5 == -1) {
      return 0;
    }
    RVar7 = ref_geom->ref_adj->item[(int)uVar5].ref;
    while (ref_geom->descr[RVar7 * 6] != 2) {
      pRVar2 = ref_geom->ref_adj->item;
      iVar1 = pRVar2[(int)uVar5].next;
      uVar5 = (ulong)iVar1;
      if (uVar5 == 0xffffffffffffffff) {
        RVar7 = -1;
      }
      else {
        RVar7 = pRVar2[uVar5].ref;
      }
      if (iVar1 == -1) {
        return 0;
      }
    }
    uVar4 = ref_egads_eval(ref_geom,RVar7,local_38,(REF_DBL *)0x0);
    uVar6 = 0xf04;
LAB_00241612:
    pcVar3 = "egads eval";
  }
  else {
    pcVar3 = "bcast n";
    uVar6 = 0xef3;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",uVar6,
         "ref_egads_gap",(ulong)uVar4,pcVar3 + 6);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_egads_gap(REF_GEOM ref_geom, REF_INT node,
                                 REF_DBL *gap) {
  REF_INT item, geom, type;
  REF_DBL dist, face_xyz[3], gap_xyz[3];
  REF_BOOL has_node, has_edge;
  *gap = 0.0;

  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &has_node), "n");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &has_edge), "n");
  if (!has_edge) return REF_SUCCESS;

  if (has_node) {
    type = REF_GEOM_NODE;
  } else {
    type = REF_GEOM_FACE;
  }
  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom)) {
      RSS(ref_egads_eval(ref_geom, geom, gap_xyz, NULL), "eval");
    }
  }

  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
      RSS(ref_egads_eval(ref_geom, geom, face_xyz, NULL), "eval");
      dist = sqrt(pow(face_xyz[0] - gap_xyz[0], 2) +
                  pow(face_xyz[1] - gap_xyz[1], 2) +
                  pow(face_xyz[2] - gap_xyz[2], 2));
      (*gap) = MAX((*gap), dist);
    }
  }

  return REF_SUCCESS;
}